

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O1

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_basic_ostream
          (sync_basic_ostream<char,_std::char_traits<char>_> *this,comm *comm,int root)

{
  undefined1 *this_00;
  undefined8 *puVar1;
  int rank;
  int rank_1;
  uint local_30;
  uint local_2c;
  
  this_00 = &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28;
  std::ios_base::ios_base((ios_base *)this_00);
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x100 = 0;
  *(undefined2 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x108 = 0;
  *(undefined8 *)&this->field_0x110 = 0;
  *(undefined8 *)&this->field_0x118 = 0;
  *(undefined8 *)&this->field_0x120 = 0;
  *(undefined8 *)&this->field_0x128 = 0;
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)0x163158;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 = 0x163180;
  std::ios::init((streambuf *)this_00);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__sync_basic_ostream_001630e8;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 =
       &PTR__sync_basic_ostream_00163110;
  *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 = comm;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10 = 0;
  *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 = root;
  puVar1 = (undefined8 *)operator_new(0x68);
  *puVar1 = std::__throw_system_error;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  std::locale::locale((locale *)(puVar1 + 7));
  *puVar1 = std::locale::locale;
  *(undefined4 *)(puVar1 + 8) = 0x18;
  puVar1[9] = puVar1 + 0xb;
  puVar1[10] = 0;
  *(undefined1 *)(puVar1 + 0xb) = 0;
  *(undefined8 **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20 = puVar1;
  if ((root < 0) || (comm->m_size <= root)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_30);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_30,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
           ,0x36,"sync_basic_ostream","0 <= root && root < comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  if (comm->m_rank == root) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_2c);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_2c,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
           ,0x37,"sync_basic_ostream","root != comm.rank()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_basic_ostream<char,_std::char_traits<char>_>).
                          _vptr_basic_ostream +
                  (long)(this->super_basic_ostream<char,_std::char_traits<char>_>).
                        _vptr_basic_ostream[-3]));
  return;
}

Assistant:

sync_basic_ostream(const mxx::comm& comm, int root) : m_comm(comm), m_stream(nullptr), m_root(root), m_buf(new strbuf_t()) {
        MXX_ASSERT(0 <= root && root < comm.size());
        MXX_ASSERT(root != comm.rank()); // the root node can't have a null stream
        this->rdbuf(m_buf.get());
    }